

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::SpellSelf(Map *this,Character *from,unsigned_short spell_id)

{
  World *pWVar1;
  Character *other;
  bool bVar2;
  int iVar3;
  int iVar4;
  ESF_Data *pEVar5;
  mapped_type *this_00;
  uint id;
  int iVar6;
  undefined6 in_register_00000012;
  int iVar7;
  _List_node_base *p_Var8;
  PacketBuilder builder;
  undefined1 local_60 [48];
  
  id = (uint)CONCAT62(in_register_00000012,spell_id);
  pEVar5 = ESF::Get(from->world->esf,id);
  if (((pEVar5->id != 0) && (pEVar5->type == Heal)) && ((int)pEVar5->tp <= from->tp)) {
    from->tp = from->tp - (int)pEVar5->tp;
    iVar7 = (int)pEVar5->hp;
    pWVar1 = this->world;
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"LimitDamage","");
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar1->config,(key_type *)local_60);
    bVar2 = util::variant::GetBool(this_00);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    if (bVar2) {
      iVar4 = from->hp;
      iVar3 = from->maxhp;
      if (iVar3 - iVar4 < iVar7) {
        iVar7 = iVar3 - iVar4;
      }
    }
    else {
      iVar4 = from->hp;
      iVar3 = from->maxhp;
    }
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    iVar7 = iVar6 + iVar4;
    if (iVar3 < iVar6 + iVar4) {
      iVar7 = iVar3;
    }
    from->hp = iVar7;
    PacketBuilder::PacketBuilder((PacketBuilder *)local_60,PACKET_SPELL,PACKET_TARGET_SELF,0xf);
    iVar7 = Character::PlayerID(from);
    PacketBuilder::AddShort((PacketBuilder *)local_60,iVar7);
    PacketBuilder::AddShort((PacketBuilder *)local_60,id);
    PacketBuilder::AddInt((PacketBuilder *)local_60,(int)pEVar5->hp);
    iVar4 = (int)(((double)from->hp / (double)from->maxhp) * 100.0);
    iVar7 = 0;
    if (0 < iVar4) {
      iVar7 = iVar4;
    }
    iVar4 = 100;
    if (iVar7 < 100) {
      iVar4 = iVar7;
    }
    PacketBuilder::AddChar((PacketBuilder *)local_60,iVar4);
    p_Var8 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var8 != (_List_node_base *)&this->characters) {
      do {
        other = (Character *)p_Var8[1]._M_next;
        if ((other != from) && (bVar2 = Character::InRange(from,other), bVar2)) {
          Character::Send(other,(PacketBuilder *)local_60);
        }
        p_Var8 = p_Var8->_M_next;
      } while (p_Var8 != (_List_node_base *)&this->characters);
    }
    PacketBuilder::AddShort((PacketBuilder *)local_60,from->hp);
    PacketBuilder::AddShort((PacketBuilder *)local_60,from->tp);
    PacketBuilder::AddShort((PacketBuilder *)local_60,1);
    Character::Send(from,(PacketBuilder *)local_60);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
  }
  return;
}

Assistant:

void Map::SpellSelf(Character *from, unsigned short spell_id)
{
	const ESF_Data& spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int hpgain = spell.hp;

	if (this->world->config["LimitDamage"])
		hpgain = std::min(hpgain, from->maxhp - from->hp);

	hpgain = std::max(hpgain, 0);

	from->hp += hpgain;

	from->hp = std::min(from->hp, from->maxhp);

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_SELF, 15);
	builder.AddShort(from->PlayerID());
	builder.AddShort(spell_id);
	builder.AddInt(spell.hp);
	builder.AddChar(util::clamp<int>(double(from->hp) / double(from->maxhp) * 100.0, 0, 100));

	UTIL_FOREACH(this->characters, character)
	{
		if (character != from && from->InRange(character))
			character->Send(builder);
	}

	builder.AddShort(from->hp);
	builder.AddShort(from->tp);
	builder.AddShort(1);

	from->Send(builder);
}